

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetScrollFromPosX(ImGuiWindow *window,float param_2,float center_x_ratio)

{
  if ((0.0 <= center_x_ratio) && (center_x_ratio <= 1.0)) {
    (window->ScrollTarget).x = (float)(int)(param_2 + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = center_x_ratio;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
    return;
  }
  __assert_fail("center_x_ratio >= 0.0f && center_x_ratio <= 1.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x2064,"void ImGui::SetScrollFromPosX(ImGuiWindow *, float, float)");
}

Assistant:

void ImGui::SetScrollFromPosX(ImGuiWindow* window, float local_x, float center_x_ratio)
{
    IM_ASSERT(center_x_ratio >= 0.0f && center_x_ratio <= 1.0f);
    window->ScrollTarget.x = IM_FLOOR(local_x + window->Scroll.x); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.x = center_x_ratio;
    window->ScrollTargetEdgeSnapDist.x = 0.0f;
}